

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

text * __thiscall lest::env::context_abi_cxx11_(text *__return_storage_ptr__,env *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  text local_38;
  
  sections_abi_cxx11_(&local_38,this);
  std::operator+(&bStack_58,&this->testing,&local_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&bStack_58);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

text context() { return testing + sections(); }